

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerProfiledBeginSwitch(Lowerer *this,JitProfilingInstr *instr)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  Opnd *opndArg;
  IntConstOpnd *opndArg_00;
  AddrOpnd *opndArg_01;
  HelperCallOpnd *this_01;
  
  if ((instr->field_0x60 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6805,"(instr->isBeginSwitch)","instr->isBeginSwitch");
    if (!bVar2) goto LAB_005b12fd;
    *puVar4 = 0;
  }
  this_00 = &this->m_lowererMD;
  opndArg = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,opndArg);
  opndArg_00 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,this->m_func);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&opndArg_00->super_Opnd);
  opndArg_01 = CreateFunctionBodyOpnd(this,(instr->super_Instr).m_func);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&opndArg_01->super_Opnd);
  this_01 = IR::HelperCallOpnd::New(HelperSimpleProfiledSwitch,this->m_func);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005b12fd;
    *puVar4 = 0;
  }
  func = (instr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005b12fd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (this_01->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar3 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar3 | 2;
  (instr->super_Instr).m_src1 = &this_01->super_Opnd;
  LowererMD::LowerCall(this_00,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledBeginSwitch(IR::JitProfilingInstr* instr)
{
    Assert(instr->isBeginSwitch);

    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, m_func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(instr->m_func));
    instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperSimpleProfiledSwitch, m_func));
    m_lowererMD.LowerCall(instr, 0);
}